

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O2

void __thiscall
InvertDatabase::get_l2file(InvertDatabase *this,string *fname,char use_seq,int *l2cnt)

{
  EqGrNode *pEVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  unsigned_long flen;
  int *piVar6;
  runtime_error *prVar7;
  int iVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  fstream file;
  byte abStack_220 [496];
  
  std::fstream::fstream(&file,(fname->_M_dataplus)._M_p,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"can\'t open l2 file");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  flen = file_size(&file);
  if (flen != 0) {
    piVar6 = read_file(&file,flen);
    if ((abStack_220[*(long *)(_file + -0x18)] & 5) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_260,"Error reading file ",fname);
      std::runtime_error::runtime_error(prVar7,(string *)&local_260);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fstream::close();
    for (lVar9 = 0; lVar9 < (int)(flen / 4); lVar9 = lVar9 + 3) {
      iVar8 = 0;
      do {
        iVar4 = ClassInfo::get_num_class
                          ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (iVar4 <= iVar8) goto LAB_00116734;
        iVar4 = piVar6[lVar9 + 2];
        iVar5 = ClassInfo::get_min_support
                          ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,iVar8);
        iVar8 = iVar8 + 1;
      } while (iVar4 < iVar5);
      bVar3 = extl2_pre_pruning(this,piVar6[lVar9 + 2],piVar6[lVar9 + 1],piVar6[lVar9],use_seq,
                                &vuint_null);
      if (!bVar3) {
        suffix_add_item_eqgraph(this,use_seq,piVar6[lVar9],piVar6[lVar9 + 1]);
        *l2cnt = *l2cnt + 1;
        pEVar1 = (this->eqgraph).
                 super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[piVar6[lVar9 + 1]].
                 super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (use_seq == '\0') {
          EqGrNode::add_sup(pEVar1,piVar6[lVar9 + 2],0);
        }
        else {
          EqGrNode::add_seqsup(pEVar1,piVar6[lVar9 + 2],0);
        }
        iVar8 = 1;
        while( true ) {
          iVar4 = ClassInfo::get_num_class
                            ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          if (iVar4 <= iVar8) break;
          pEVar1 = (this->eqgraph).
                   super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[piVar6[lVar9 + 1]].
                   super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (use_seq == '\0') {
            EqGrNode::add_sup(pEVar1,0,iVar8);
          }
          else {
            EqGrNode::add_seqsup(pEVar1,0,iVar8);
          }
          iVar8 = iVar8 + 1;
        }
      }
LAB_00116734:
    }
    if (piVar6 != (int *)0x0) {
      operator_delete__(piVar6);
    }
  }
  std::fstream::~fstream(&file);
  return;
}

Assistant:

void InvertDatabase::get_l2file(const string& fname, char use_seq, int &l2cnt) {
    fstream file(fname.c_str(), ios::binary);
    if (!file.is_open()) {
        throw runtime_error("can't open l2 file");
    }
    unsigned long flen = file_size(file);
    if (flen > 0) {
        int *cntary = read_file(file, flen);

        if (!file) {
            throw runtime_error("Error reading file " + fname);
        }
        file.close();

        // build eqgraph -- large 2-itemset relations
        int lim = flen / INT_SIZE;
        char lflg = 0;
        int i, j;
        for (i = 0; i < lim; i += 3) {
            lflg = 0;
            for (j = 0; j < cls->get_num_class(); j++) {
                if (cntary[i + 2] >= cls->get_min_support(j)) {
                    lflg = 1;
                    break;
                }
            }
            if (lflg) {
                if (!extl2_pre_pruning(cntary[i + 2], cntary[i + 1], cntary[i], use_seq, vuint_null)) {
                    suffix_add_item_eqgraph(use_seq, cntary[i], cntary[i + 1]);
                    l2cnt++;
                    //assign sup to a single class, sice we don't know breakup
                    if (use_seq) eqgraph[cntary[i + 1]]->add_seqsup(cntary[i + 2], 0);
                    else eqgraph[cntary[i + 1]]->add_sup(cntary[i + 2], 0);
                    for (j = 1; j < cls->get_num_class(); j++)
                        if (use_seq) eqgraph[cntary[i + 1]]->add_seqsup(0, j);
                        else eqgraph[cntary[i + 1]]->add_sup(0, j);
                }
            }
        }

        delete [] cntary;
    }
}